

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileByName
          (MergedDescriptorDatabase *this,string *filename,FileDescriptorProto *output)

{
  pointer ppDVar1;
  DescriptorDatabase *pDVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    ppDVar1 = (this->sources_).
              super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->sources_).
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3;
    if (uVar6 <= uVar5) break;
    pDVar2 = ppDVar1[uVar5];
    iVar4 = (*pDVar2->_vptr_DescriptorDatabase[2])(pDVar2,filename,output);
    uVar3 = uVar5 + 1;
  } while ((char)iVar4 == '\0');
  return uVar5 < uVar6;
}

Assistant:

bool MergedDescriptorDatabase::FindFileByName(const std::string& filename,
                                              FileDescriptorProto* output) {
  for (int i = 0; i < sources_.size(); i++) {
    if (sources_[i]->FindFileByName(filename, output)) {
      return true;
    }
  }
  return false;
}